

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostinfo.c
# Opt level: O0

char * fetch_aton_digit(char *p,char *end,uchar *value)

{
  bool bVar1;
  int local_34;
  ulong uStack_30;
  int v;
  size_t ndigits;
  uchar *value_local;
  char *end_local;
  char *p_local;
  
  uStack_30 = 0;
  local_34 = 0;
  end_local = p;
  while( true ) {
    bVar1 = false;
    if ((end_local != end) && (bVar1 = false, '/' < *end_local)) {
      bVar1 = *end_local < ':';
    }
    if (!bVar1) break;
    local_34 = local_34 * 10 + (int)*end_local + -0x30;
    uStack_30 = uStack_30 + 1;
    end_local = end_local + 1;
  }
  if ((uStack_30 == 0) || (3 < uStack_30)) {
    p_local = (char *)0x0;
  }
  else if (local_34 < 0x100) {
    *value = (uchar)local_34;
    p_local = end_local;
  }
  else {
    p_local = (char *)0x0;
  }
  return p_local;
}

Assistant:

static const char *fetch_aton_digit(const char *p, const char *end, unsigned char *value)
{
    size_t ndigits = 0;
    int v = 0;

    while (p != end && ('0' <= *p && *p <= '9')) {
        v = v * 10 + *p++ - '0';
        ++ndigits;
    }
    if (!(1 <= ndigits && ndigits <= 3))
        return NULL;
    if (v > 255)
        return NULL;
    *value = (unsigned char)v;
    return p;
}